

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind.cpp
# Opt level: O0

void init_table_entry(uint8_t opcode,OpEffect *e)

{
  uint uVar1;
  long lVar2;
  int *piVar3;
  OpCode *oc;
  OpEffect *e_local;
  uint8_t opcode_local;
  
  lVar2 = (ulong)opcode * 0x10;
  piVar3 = (int *)(snestistics::op_codes + lVar2);
  e->source = 0;
  e->dest = 0;
  e->side_source = 0;
  e->side_dest = 0;
  e->size = SMALL;
  e->mixing_low_high = false;
  *(undefined3 *)&e->field_0x15 = 0;
  e->mixing_low_high = false;
  e->size = AUTOASSIGN;
  switch(*(undefined4 *)(snestistics::op_codes + lVar2 + 8)) {
  case 0:
  case 4:
  case 5:
  case 6:
  case 0xb:
  case 0xf:
  case 0x11:
  case 0x16:
    e->source = e->source | 0x20000;
    break;
  case 1:
  case 2:
  case 7:
  case 0xc:
  case 0xd:
    e->source = e->source | 0x20000;
    e->side_source = e->side_source | 8;
    break;
  case 3:
  case 0xe:
  case 0x10:
  case 0x12:
  case 0x17:
    e->source = e->source | 0x20000;
    e->side_source = e->side_source | 0x40;
    break;
  case 8:
    e->source = e->source | 1;
    break;
  case 9:
  case 10:
  case 0x13:
  case 0x14:
  case 0x15:
  }
  uVar1 = *(uint *)(snestistics::op_codes + lVar2 + 8);
  if (((uVar1 < 5) || (uVar1 == 0xc)) || (uVar1 == 0xf || uVar1 == 0x10)) {
    e->side_source = e->side_source | 0x8000;
  }
  switch(*piVar3) {
  case 0:
  case 0x40:
    e->source = e->source | 1;
    e->dest = e->dest | 1;
    e->side_dest = e->side_dest | 0x3a00;
    e->mixing_low_high = true;
    break;
  case 1:
  case 0x1a:
  case 0x29:
    e->source = e->source | 1;
    e->dest = e->dest | 1;
    e->side_dest = e->side_dest | 0x3000;
    break;
  case 2:
  case 0x25:
    e->size = MEMORY;
    e->dest = e->source | e->dest;
    e->side_dest = e->side_dest | 0x3200;
    e->mixing_low_high = true;
    break;
  case 3:
  case 4:
  case 5:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x10:
  case 0x11:
  case 0x14:
  case 0x1e:
  case 0x1f:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x2b:
  case 0x42:
  case 0x43:
  case 0x46:
  case 0x58:
  case 0x59:
    e->size = NONE;
    break;
  case 6:
    e->size = MEMORY;
    e->dest = e->dest | 0x2000;
    if (*(int *)(snestistics::op_codes + lVar2 + 8) != 0x14) {
      e->dest = e->dest | 0x1800;
    }
    break;
  case 0xf:
  case 0x41:
    e->dest = e->dest | 0x200;
    e->size = NONE;
    break;
  case 0x12:
    e->dest = e->dest | 0x800;
    e->size = NONE;
    break;
  case 0x13:
    e->source = e->source | 1;
    e->dest = e->dest | 0x3200;
    break;
  case 0x15:
    e->source = e->source | 8;
    e->dest = e->dest | 0x3200;
    break;
  case 0x16:
    e->source = e->source | 0x40;
    e->dest = e->dest | 0x3200;
    break;
  case 0x17:
  case 0x1b:
    e->dest = e->source | e->dest;
    e->side_dest = e->side_dest | 0x3000;
    e->mixing_low_high = true;
    e->size = MEMORY;
    break;
  case 0x18:
    e->dest = e->dest | 8;
    e->source = e->source | 8;
    e->side_dest = e->side_dest | 0x3000;
    e->mixing_low_high = true;
    break;
  case 0x19:
    e->dest = e->dest | 0x40;
    e->source = e->source | 0x40;
    e->side_dest = e->side_dest | 0x3000;
    e->mixing_low_high = true;
    break;
  case 0x1c:
    e->source = e->source | 8;
    e->dest = e->dest | 8;
    e->side_dest = e->side_dest | 0x3000;
    e->mixing_low_high = true;
    break;
  case 0x1d:
    e->source = e->source | 0x40;
    e->dest = e->dest | 0x40;
    e->side_dest = e->side_dest | 0x3000;
    e->mixing_low_high = true;
    break;
  case 0x20:
    e->dest = e->dest | 0x20000;
    e->source = e->source | 0x10000;
    e->size = NONE;
    break;
  case 0x21:
    e->dest = e->dest | 0x20000;
    e->size = NONE;
    break;
  case 0x22:
    if (*(int *)(snestistics::op_codes + lVar2 + 8) != 0x14) {
      e->source = e->source | 0x20000;
    }
    e->dest = e->dest | 1;
    break;
  case 0x23:
    if (*(int *)(snestistics::op_codes + lVar2 + 8) != 0x13) {
      e->source = e->source | 0x20000;
    }
    e->dest = e->dest | 8;
    break;
  case 0x24:
    if (*(int *)(snestistics::op_codes + lVar2 + 8) != 0x13) {
      e->source = e->source | 0x20000;
    }
    e->dest = e->dest | 0x40;
    break;
  case 0x2a:
    e->dest = e->dest | 0x20000;
    e->size = WIDE;
    break;
  case 0x2c:
    e->dest = e->dest | 0x20000;
    e->size = WIDE;
    break;
  case 0x2d:
    e->source = e->source | 1;
    e->dest = e->dest | 0x20000;
    e->size = MEMORY;
    break;
  case 0x2e:
    e->source = e->source | 0x8000;
    e->dest = e->dest | 0x20000;
    e->size = SMALL;
    break;
  case 0x2f:
    e->source = e->source | 0x40000;
    e->dest = e->dest | 0x20000;
    e->size = WIDE;
    break;
  case 0x30:
    e->source = e->source | 0x10000;
    e->dest = e->dest | 0x20000;
    e->size = SMALL;
    break;
  case 0x31:
    e->source = e->source | 0x3a00;
    e->dest = e->dest | 0x20000;
    e->size = SMALL;
    break;
  case 0x32:
    e->source = e->source | 8;
    e->dest = e->dest | 0x20000;
    e->size = INDEX;
    break;
  case 0x33:
    e->source = e->source | 0x40;
    e->dest = e->dest | 0x20000;
    e->size = INDEX;
    break;
  case 0x34:
    e->source = e->source | 0x20000;
    e->dest = e->dest | 1;
    e->side_dest = e->side_dest | 0x3000;
    break;
  case 0x35:
    e->source = e->source | 0x20000;
    e->dest = e->dest | 0x8000;
    e->side_dest = e->side_dest | 0x3000;
    e->size = SMALL;
    break;
  case 0x36:
    e->source = e->source | 0x20000;
    e->dest = e->dest | 0x40000;
    e->side_dest = e->side_dest | 0x3000;
    e->size = WIDE;
    break;
  case 0x37:
    e->source = e->source | 0x20000;
    e->dest = e->dest | 0x3a00;
    e->size = SMALL;
    break;
  case 0x38:
    e->source = e->source | 0x20000;
    e->dest = e->dest | 8;
    e->side_dest = e->side_dest | 0x3000;
    break;
  case 0x39:
    e->source = e->source | 0x20000;
    e->dest = e->dest | 0x40;
    e->side_dest = e->side_dest | 0x3000;
    break;
  case 0x3a:
  case 0x44:
    e->size = NONE;
    break;
  case 0x3b:
  case 0x3c:
    e->size = MEMORY;
    e->dest = e->source | e->dest;
    e->side_source = e->side_source | 0x200;
    e->side_dest = e->side_dest | 0x3200;
    e->mixing_low_high = true;
    break;
  case 0x3d:
  case 0x3f:
    e->source = e->source | 0x20000;
    e->size = NONE;
    break;
  case 0x3e:
    e->source = e->source | 0x20000;
    e->dest = e->dest | 0x10000;
    e->size = NONE;
    break;
  case 0x45:
    e->dest = e->source;
    e->source = 1;
    break;
  case 0x47:
    e->dest = e->source;
    e->source = 8;
    break;
  case 0x48:
    e->dest = e->source;
    e->source = 0x40;
    break;
  case 0x49:
    e->dest = e->source;
    e->source = 0;
    e->size = MEMORY;
    break;
  case 0x4a:
    e->dest = e->dest | 8;
    e->source = e->source | 1;
    e->side_dest = e->side_dest | 0x3000;
    break;
  case 0x4b:
    e->dest = e->dest | 0x40;
    e->source = e->source | 1;
    e->side_dest = e->side_dest | 0x3000;
    break;
  case 0x4c:
    e->dest = e->dest | 0x40000;
    e->source = e->source | 6;
    e->side_dest = e->side_dest | 0x3000;
    e->size = WIDE;
    break;
  case 0x4d:
    e->source = e->source | 6;
    e->dest = e->dest | 0x4000;
    e->side_dest = e->side_dest | 0x3000;
    e->size = WIDE;
    break;
  case 0x4e:
    e->dest = e->dest | 6;
    e->source = e->source | 0x40000;
    e->side_dest = e->side_dest | 0x3000;
    e->size = WIDE;
    break;
  case 0x4f:
  case 0x50:
    e->dest = e->source | e->dest;
    e->source = e->source | 1;
    e->side_dest = e->side_dest | 0x2000;
    e->size = MEMORY;
    break;
  case 0x51:
    e->dest = e->dest | 6;
    e->source = e->source | 0x4000;
    e->side_dest = e->side_dest | 0x3000;
    e->size = WIDE;
    break;
  case 0x52:
    e->source = e->source | 0x4000;
    e->dest = e->dest | 0x30;
    e->side_dest = e->side_dest | 0x3000;
    e->size = WIDE;
    break;
  case 0x53:
    e->dest = e->dest | 1;
    e->source = e->source | 8;
    e->side_dest = e->side_dest | 0x3000;
    break;
  case 0x54:
    e->dest = e->dest | 0x4000;
    e->source = e->source | 0x30;
    e->side_dest = e->side_dest | 0x3000;
    e->size = WIDE;
    break;
  case 0x55:
    e->dest = e->dest | 0x40;
    e->source = e->source | 8;
    e->side_dest = e->side_dest | 0x3000;
    break;
  case 0x56:
    e->dest = e->dest | 1;
    e->source = e->source | 0x40;
    e->side_dest = e->side_dest | 0x3000;
    break;
  case 0x57:
    e->dest = e->dest | 8;
    e->source = e->source | 0x40;
    e->side_dest = e->side_dest | 0x3000;
    break;
  case 0x5a:
    e->source = e->source | 6;
    e->dest = e->dest | 6;
    e->side_dest = e->side_dest | 0x3000;
    e->size = WIDE;
    e->mixing_low_high = true;
    break;
  case 0x5b:
    e->source = e->source | 0x600;
    e->dest = e->dest | 0x600;
    e->size = NONE;
    break;
  default:
    printf("%s\n",*(undefined8 *)(snestistics::Operation_names + (long)*piVar3 * 8));
  }
  if (e->size == AUTOASSIGN) {
    if ((e->dest & 1) != 0) {
      e->size = MEMORY;
    }
    if ((e->dest & 8) != 0) {
      e->size = INDEX;
    }
    if ((e->dest & 0x40) != 0) {
      e->size = INDEX;
    }
  }
  if (e->size == AUTOASSIGN) {
    if ((e->source & 1) != 0) {
      e->size = MEMORY;
    }
    if ((e->source & 8) != 0) {
      e->size = INDEX;
    }
    if ((e->source & 0x40) != 0) {
      e->size = INDEX;
    }
  }
  if (e->size != AUTOASSIGN) {
    return;
  }
  printf("%s %s\n",*(undefined8 *)(snestistics::Operation_names + (long)*piVar3 * 8),
         *(undefined8 *)
          (snestistics::Operand_names + (long)*(int *)(snestistics::op_codes + lVar2 + 8) * 8));
  exit(1);
}

Assistant:

void init_table_entry(const uint8_t opcode, OpEffect &e) {
	const OpCode& oc = op_codes[opcode];
	memset(&e, 0, sizeof(e));

	e.mixing_low_high = false;
	e.size = OpEffect::Size::AUTOASSIGN;

	// TODO: Jumps and branches don't quite load... but they also dont move data... fix in op

	// Fill in source based on operand mode
	// TODO: Fill in DB for the modes that read it (only for non-jumps of course)
	switch(oc.mode) {
	case Operand::ABSOLUTE:
	case Operand::ABSOLUTE_INDIRECT:
	case Operand::ABSOLUTE_INDIRECT_LONG:
	case Operand::ABSOLUTE_LONG:
	case Operand::DIRECT_PAGE:
	case Operand::DIRECT_PAGE_INDIRECT:
	case Operand::DIRECT_PAGE_INDIRECT_LONG:
	case Operand::STACK_RELATIVE:
		e.source |= thing::MEM;
		break;
	case Operand::ABSOLUTE_INDEXED_X:
	case Operand::ABSOLUTE_INDEXED_X_INDIRECT:
	case Operand::ABSOLUTE_LONG_INDEXED_X:
	case Operand::DIRECT_PAGE_INDEXED_X:
	case Operand::DIRECT_PAGE_INDEXED_X_INDIRECT:
		e.source |= thing::MEM;
		e.side_source |= thing::X;
		break;
	case Operand::ABSOLUTE_INDEXED_Y:
	case Operand::DIRECT_PAGE_INDEXED_Y:
	case Operand::DIRECT_PAGE_INDIRECT_INDEXED_Y:
	case Operand::DIRECT_PAGE_INDIRECT_LONG_INDEXED_Y:
	case Operand::STACK_RELATIVE_INDIRECT_INDEXED_Y:
		e.source |= thing::MEM;
		e.side_source |= thing::Y;
		break;
	case Operand::ACCUMULATOR:
		e.source |= thing::A;
		break;
	case Operand::IMMEDIATE_INDEX:
	case Operand::IMMEDIATE_MEMORY:
	case Operand::MANUAL:
	case Operand::BRANCH_8:
	case Operand::BRANCH_16:
		break;
	};

	switch(oc.mode) {
	case Operand::ABSOLUTE:
	case Operand::ABSOLUTE_INDEXED_X:
	case Operand::ABSOLUTE_INDEXED_Y:
	case Operand::ABSOLUTE_INDIRECT:
	case Operand::ABSOLUTE_INDEXED_X_INDIRECT:
	case Operand::DIRECT_PAGE_INDEXED_X:
	case Operand::DIRECT_PAGE_INDIRECT:
	case Operand::DIRECT_PAGE_INDIRECT_INDEXED_Y:
		e.side_source |= thing::DB;
		break;
	default:
		break;
	};

	switch(oc.op) {
	case Operation::AND:
	case Operation::EOR:
	case Operation::ORA:
	{
		e.source |= thing::A;
		e.dest |= thing::A;
		e.side_dest |= thing::NZ;
		break;
	}
	case Operation::ASL:
	case Operation::LSR:
	{
		e.size = OpEffect::Size::MEMORY;
		e.dest |= e.source;
		e.side_dest |= thing::NZC;
		e.mixing_low_high = true;
		break;
	}
	case Operation::ROL:
	case Operation::ROR:
	{
		e.size = OpEffect::Size::MEMORY;
		e.dest |= e.source;
		e.side_source |= thing::FLAG_CARRY;
		e.side_dest |= thing::NZC;
		e.mixing_low_high = true;
		break;
	}
	case Operation::ADC:
	case Operation::SBC:
	{
		e.source |= thing::A; // TODO: Perhaps this is a side source?
		e.dest |= thing::A;
		e.side_dest |= thing::NZC|thing::FLAG_OVERFLOW;
		e.mixing_low_high = true;
		break;
	}
	case Operation::PHP: {
		e.source |= thing::FLAGS_LOWER;
		e.dest |= thing::MEM;
		e.size = OpEffect::Size::SMALL;
		break;
	}
	case Operation::PLA: {
		e.source |= thing::MEM;
		e.dest |= thing::A;
		e.side_dest |= thing::NZ;
		break;
	}
	case Operation::PLB: {
		e.source |= thing::MEM;
		e.dest |= thing::DB;
		e.side_dest |= thing::NZ;
		e.size = OpEffect::Size::SMALL;
		break;
	}
	case Operation::PLY: {
		e.source |= thing::MEM;
		e.dest |= thing::Y;
		e.side_dest |= thing::NZ;
		break;
	}
	case Operation::PLX: {
		e.source |= thing::MEM;
		e.dest |= thing::X;
		e.side_dest |= thing::NZ;
		break;
	}
	case Operation::PLP: {
		e.source |= thing::MEM;
		e.dest |= thing::FLAGS_LOWER;
		e.size = OpEffect::Size::SMALL;
		// Will write upper byte of XY as well if we went to 8-bit index TODO
		break;
	}
	case Operation::PHD: {
		e.source |= thing::DP;
		e.dest |= thing::MEM;
		e.size = OpEffect::Size::WIDE;
		break;
	}
	case Operation::PHY: {
		e.source |= thing::Y;
		e.dest |= thing::MEM;
		e.size = OpEffect::Size::INDEX;
		break;
	}
	case Operation::PHX: {
		e.source |= thing::X;
		e.dest |= thing::MEM;
		e.size = OpEffect::Size::INDEX;
		break;
	}
	case Operation::PHA: {
		e.source |= thing::A;
		e.dest |= thing::MEM;
		e.size = OpEffect::Size::MEMORY;
		break;
	}
	case Operation::PHB: {
		e.source |= thing::DB;
		e.dest |= thing::MEM;
		e.size = OpEffect::Size::SMALL;
		break;
	}
	case Operation::PHK: {
		e.source |= thing::PB;
		e.dest |= thing::MEM;
		e.size = OpEffect::Size::SMALL;
		break;
	}
	case Operation::PLD: {
		e.source |= thing::MEM;
		e.dest |= thing::DP;
		e.side_dest |= thing::NZ;
		e.size = OpEffect::Size::WIDE;
		break;
	}
	case Operation::CLV:
	{
		e.dest |= thing::FLAG_OVERFLOW;
		e.size = OpEffect::Size::NONE;
		break;
	}
	case Operation::SEC:
	case Operation::CLC:
	{
		e.dest |= thing::FLAG_CARRY;
		e.size = OpEffect::Size::NONE;
		break;
	}
	case Operation::BIT: {
		e.size = OpEffect::Size::MEMORY;
		e.dest |= thing::FLAG_ZERO;
		if (oc.mode != Operand::IMMEDIATE_MEMORY)
			e.dest |= thing::FLAG_NEGATIVE|thing::FLAG_OVERFLOW;
		break;
	}
	case Operation::INY:
	{
		e.source |= thing::Y;
		e.dest |= thing::Y;
		e.side_dest |= thing::NZ;
		e.mixing_low_high = true;
		break;
	}
	case Operation::INX:
	{
		e.source |= thing::X;
		e.dest |= thing::X;
		e.side_dest |= thing::NZ;
		e.mixing_low_high = true;
		break;
	}
	case Operation::INC:
	case Operation::DEC:
	{
		e.dest |= e.source;
		e.side_dest |= thing::NZ;
		e.mixing_low_high = true;
		e.size = OpEffect::Size::MEMORY;
		break;
	}
	case Operation::DEY:
	{
		e.dest  |= thing::Y;
		e.source |= thing::Y;
		e.side_dest |= thing::NZ;
		e.mixing_low_high = true;
		break;
	}
	case Operation::DEX:
	{
		e.dest  |= thing::X;
		e.source |= thing::X;
		e.side_dest |= thing::NZ;
		e.mixing_low_high = true;
		break;
	}
	case Operation::TCS: {
		e.source |= thing::AL|thing::AH; // TODO: Is this a good way to indicate always 16-bit A?
		e.dest |= thing::S;
		e.side_dest |= thing::NZ;
		e.size = OpEffect::Size::WIDE;
		break;
	}
	case Operation::TSC:
	{
		e.dest  |= thing::AL|thing::AH; // TODO: Is this a good way to indicate always 16-bit A?
		e.source |= thing::S;
		e.side_dest |= thing::NZ;
		e.size = OpEffect::Size::WIDE;
		break;
	}
	case Operation::TCD:
	{
		e.dest  |= thing::DP;
		e.source |= thing::AL|thing::AH;
		e.side_dest |= thing::NZ;
		e.size = OpEffect::Size::WIDE;
		break;
	}
	case Operation::TDC:
	{
		e.dest |= thing::AL|thing::AH;
		e.source |= thing::DP;
		e.side_dest |= thing::NZ;
		e.size = OpEffect::Size::WIDE;
		break;
	}
	case Operation::TXA:
	{
		e.dest |= thing::A;
		e.source |= thing::X;
		e.side_dest |= thing::NZ;
		break;
	}
	case Operation::TAX:
	{
		e.dest |= thing::X;
		e.source |= thing::A;
		e.side_dest |= thing::NZ;
		break;
	}
	case Operation::TYA:
	{
		e.dest |= thing::A;
		e.source |= thing::Y;
		e.side_dest |= thing::NZ;
		break;
	}
	case Operation::TAY:
	{
		e.dest |= thing::Y;
		e.source |= thing::A;
		e.side_dest |= thing::NZ;
		break;
	}
	case Operation::TXS:
	{
		e.dest |= thing::S;
		e.source |= thing::XL|thing::XH;
		e.side_dest |= thing::NZ;
		e.size = OpEffect::Size::WIDE;
		break;
	}
	case Operation::TSX:
	{
		e.source |= thing::S;
		e.dest |= thing::XL|thing::XH;
		e.side_dest |= thing::NZ;
		e.size = OpEffect::Size::WIDE;
		break;
	}
	case Operation::TXY:
	{
		e.dest |= thing::Y;
		e.source |= thing::X;
		e.side_dest |= thing::NZ;
		break;
	}
	case Operation::TYX:
	{
		e.dest |= thing::X;
		e.source |= thing::Y;
		e.side_dest |= thing::NZ;
		break;
	}
	case Operation::PER:
	{
		e.dest |= thing::MEM;
		e.size = OpEffect::Size::WIDE; // We don't have this one afaik
		break;
	}
	case Operation::PEA:
	{
		e.dest |= thing::MEM;
		e.size = OpEffect::Size::WIDE;
		break;
	}
	case Operation::CPY:
	{
		e.source |= thing::Y;
		e.dest |= thing::NZC;
		break;
	}
	case Operation::CPX:
	{
		e.source |= thing::X;
		e.dest |= thing::NZC;
		break;
	}
	case Operation::CMP:
	{
		e.source |= thing::A;
		e.dest |= thing::NZC;
		break;
	}
	case Operation::STA:
	{
		e.dest = e.source;
		e.source = thing::A;
		break;
	}
	case Operation::STX:
	{
		e.dest = e.source;
		e.source = thing::X;
		break;
	}
	case Operation::STY:
	{
		e.dest = e.source;
		e.source = thing::Y;
		break;
	}
	case Operation::STZ:
	{
		e.dest = e.source;
		e.source = 0;
		e.size = OpEffect::Size::MEMORY;
		break;
	}
	case Operation::LDA:
	{
		if (oc.mode != Operand::IMMEDIATE_MEMORY)
			e.source |= thing::MEM;
		e.dest |= thing::A;
		break;
	}
	case Operation::LDX:
	{
		if (oc.mode != Operand::IMMEDIATE_INDEX)
			e.source |= thing::MEM;
		e.dest |= thing::X;
		break;
	}
	case Operation::LDY:
	{
		if (oc.mode != Operand::IMMEDIATE_INDEX)
			e.source |= thing::MEM;
		e.dest |= thing::Y;
		break;
	}
	case Operation::TSB:
	case Operation::TRB:
	{
		e.dest |= e.source;
		e.source |= thing::A;
		e.side_dest |= thing::FLAG_ZERO;
		e.size = OpEffect::Size::MEMORY;
		break;
	}
	case Operation::SEP:
	case Operation::REP:
	{
		e.size = OpEffect::Size::NONE;
		// Special case since the bits they affect depends on the operand
		// Tracking will special case these
		break;
	}
	case Operation::XBA:
	{
		// Here the model falls apart...  If we tracked AL we shall track AH and vice versa
		e.source |= thing::AL|thing::AH;
		e.dest |= thing::AL|thing::AH;
		e.side_dest |= thing::NZ;
		e.size = OpEffect::Size::WIDE;
		e.mixing_low_high = true;
		break;
	}
	case Operation::XCE:
	{
		// Here the model falls apart...  If we tracked carry we shall track emu and vice versa
		e.source |= thing::FLAG_CARRY|thing::FLAG_EMULATION;
		e.dest |= thing::FLAG_CARRY|thing::FLAG_EMULATION;
		e.size = OpEffect::Size::NONE;
		break;
	}
	case Operation::JSR: // Modifies stack
	{
		e.dest |= thing::MEM; // Pushes to stack
		e.size = OpEffect::Size::NONE;
		break;
	}
	case Operation::JSL: // Modifies stack
	{
		e.dest |= thing::MEM; // Pushes to stack
		e.source |= thing::PB;
		e.size = OpEffect::Size::NONE;
		break;
	}
	case Operation::RTI: // Modifies stack
	case Operation::RTS: // Modifies stack
	{
		e.source |= thing::MEM; // Pulls from stack
		e.size = OpEffect::Size::NONE;
		break;
	}
	case Operation::RTL: // Modifies stack
	{
		e.source |= thing::MEM; // Pulls from stack
		e.dest |= thing::PB;
		e.size = OpEffect::Size::NONE;
		break;
	}
	case Operation::BRK:
	case Operation::COP:
	case Operation::STP:
	case Operation::NOP:
	case Operation::BPL:
	case Operation::BCC:
	case Operation::BCS:
	case Operation::BEQ:
	case Operation::BMI:
	case Operation::BNE:
	case Operation::BRA:
	case Operation::BVC:
	case Operation::BVS:
	case Operation::JMP:
	case Operation::JML:
	case Operation::WDM:
	case Operation::BRL:
	case Operation::MVP:
	case Operation::MVN:
	case Operation::WAI:
	case Operation::PEI:
	case Operation::SED: // We don't track decimal flag
	case Operation::CLD: // We don't track decimal flag
	case Operation::CLI: // We don't track IRQ flag
	case Operation::SEI: // We don't track IRQ flag
	{
		e.size = OpEffect::Size::NONE;
		// TODO
		break;
	}
	default:
		printf("%s\n", Operation_names[(int)oc.op]);
	};

	if (e.size == OpEffect::Size::AUTOASSIGN) {
		if (e.dest & thing::A) e.size = OpEffect::Size::MEMORY;
		if (e.dest & thing::X) e.size = OpEffect::Size::INDEX;
		if (e.dest & thing::Y) e.size = OpEffect::Size::INDEX;
	}
	if (e.size == OpEffect::Size::AUTOASSIGN) {
		if (e.source & thing::A) e.size = OpEffect::Size::MEMORY;
		if (e.source & thing::X) e.size = OpEffect::Size::INDEX;
		if (e.source & thing::Y) e.size = OpEffect::Size::INDEX;
	}

	if (e.size == OpEffect::Size::AUTOASSIGN) {
		printf("%s %s\n", Operation_names[(int)oc.op], Operand_names[(int)oc.mode]);
		exit(1);
	}
}